

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O2

int32_t __thiscall fasttext::FastText::getLabelId(FastText *this,string *label)

{
  int32_t iVar1;
  int32_t iVar2;
  string_view w;
  
  w._M_str = (label->_M_dataplus)._M_p;
  w._M_len = label->_M_string_length;
  iVar1 = Dictionary::getId((this->dict_).
                            super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr,w);
  if (iVar1 == -1) {
    iVar1 = -1;
  }
  else {
    iVar2 = Dictionary::nwords((this->dict_).
                               super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr);
    iVar1 = iVar1 - iVar2;
  }
  return iVar1;
}

Assistant:

int32_t FastText::getLabelId(const std::string& label) const {
  int32_t labelId = dict_->getId(label);
  if (labelId != -1) {
    labelId -= dict_->nwords();
  }
  return labelId;
}